

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

ImageChannelValues * __thiscall
pbrt::Image::GetChannels
          (ImageChannelValues *__return_storage_ptr__,Image *this,Point2i p,ImageChannelDesc *desc,
          WrapMode2D wrapMode)

{
  PixelFormat PVar1;
  size_t sVar2;
  float *pfVar3;
  bool bVar4;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar5;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar6;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  int i_2;
  int i_1;
  ulong uVar11;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar12;
  float fVar13;
  span<const_unsigned_char> vin;
  span<float> vout;
  Point2i p_local;
  
  p_local = p;
  ImageChannelValues::ImageChannelValues(__return_storage_ptr__,(desc->offset).nStored,0.0);
  bVar4 = RemapPixelCoords(&p_local,(Point2i)(this->resolution).super_Tuple2<pbrt::Point2,_int>,
                           wrapMode);
  if (bVar4) {
    PVar1 = this->format;
    lVar10 = (long)((p_local.super_Tuple2<pbrt::Point2,_int>.y *
                     (this->resolution).super_Tuple2<pbrt::Point2,_int>.x +
                    p_local.super_Tuple2<pbrt::Point2,_int>.x) * (int)(this->channelNames).nStored);
    if (PVar1 == U256) {
      lVar9 = 0;
      for (uVar11 = 0; uVar11 < (desc->offset).nStored; uVar11 = uVar11 + 1) {
        paVar5 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                  *)(desc->offset).ptr;
        paVar6 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)(__return_storage_ptr__->
                    super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
        if (paVar5 == (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                       *)0x0) {
          paVar5 = &(desc->offset).field_2;
        }
        vin.ptr = (this->p8).ptr + paVar5->fixed[uVar11] + lVar10;
        if (paVar6 == (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                       *)0x0) {
          paVar6 = &(__return_storage_ptr__->
                    super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2
          ;
        }
        vout.ptr = (float *)((long)paVar6 + lVar9);
        vin.n = 1;
        vout.n = 1;
        ColorEncodingHandle::ToLinear(&this->encoding,vin,vout);
        lVar9 = lVar9 + 4;
      }
    }
    else if (PVar1 == Half) {
      for (uVar11 = 0; uVar11 < (desc->offset).nStored; uVar11 = uVar11 + 1) {
        paVar5 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                  *)(desc->offset).ptr;
        if (paVar5 == (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                       *)0x0) {
          paVar5 = &(desc->offset).field_2;
        }
        fVar13 = Half::operator_cast_to_float((this->p16).ptr + lVar10 + paVar5->fixed[uVar11]);
        paVar6 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                  *)(__return_storage_ptr__->
                    super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
        if (paVar6 == (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                       *)0x0) {
          paVar6 = &(__return_storage_ptr__->
                    super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2
          ;
        }
        paVar6->fixed[uVar11] = fVar13;
      }
    }
    else {
      if (PVar1 != Float) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                 ,0x19c,"Unhandled PixelFormat");
      }
      paVar5 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                *)(desc->offset).ptr;
      sVar2 = (desc->offset).nStored;
      paVar12 = &(desc->offset).field_2;
      if (paVar5 != (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                     *)0x0) {
        paVar12 = paVar5;
      }
      pfVar3 = (this->p32).ptr;
      paVar6 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                *)(__return_storage_ptr__->
                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
      paVar7 = &(__return_storage_ptr__->
                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
      if (paVar6 != (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                     *)0x0) {
        paVar7 = paVar6;
      }
      for (sVar8 = 0; sVar2 != sVar8; sVar8 = sVar8 + 1) {
        paVar7->fixed[sVar8] = pfVar3[lVar10 + paVar12->fixed[sVar8]];
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ImageChannelValues Image::GetChannels(Point2i p, const ImageChannelDesc &desc,
                                      WrapMode2D wrapMode) const {
    ImageChannelValues cv(desc.offset.size(), Float(0));
    if (!RemapPixelCoords(&p, resolution, wrapMode))
        return cv;

    size_t pixelOffset = PixelOffset(p);
    switch (format) {
    case PixelFormat::U256: {
        for (int i = 0; i < desc.offset.size(); ++i)
            encoding.ToLinear({&p8[pixelOffset + desc.offset[i]], 1}, {&cv[i], 1});
        break;
    }
    case PixelFormat::Half: {
        for (int i = 0; i < desc.offset.size(); ++i)
            cv[i] = Float(p16[pixelOffset + desc.offset[i]]);
        break;
    }
    case PixelFormat::Float: {
        for (int i = 0; i < desc.offset.size(); ++i)
            cv[i] = p32[pixelOffset + desc.offset[i]];
        break;
    }
    default:
        LOG_FATAL("Unhandled PixelFormat");
    }

    return cv;
}